

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomConnections::read(DomConnections *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QStringView other;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomConnection *v;
  QStringView tag;
  parameter_type in_stack_ffffffffffffff48;
  parameter_type this_00;
  DomConnection *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  DomConnection *in_stack_ffffffffffffff68;
  parameter_type pDVar5;
  DomConnections *pDVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (parameter_type)CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19ef6a);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0019f103;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_ffffffffffffff68,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,(QString *)CONCAT44(iVar3,in_stack_ffffffffffffff58));
      __nbytes_00 = 0;
      other.m_data = (storage_type_conflict *)pDVar6;
      other.m_size = (qsizetype)this_00;
      iVar4 = QStringView::compare((QStringView *)in_stack_ffffffffffffff48,other,CaseInsensitive);
      in_stack_ffffffffffffff58 = CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff58) ^ 0xff000000;
      QString::~QString((QString *)0x19f033);
      if ((in_stack_ffffffffffffff58 & 0x1000000) == 0) {
        pDVar5 = this_00;
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(iVar3,in_stack_ffffffffffffff58),
                   (size_t)in_stack_ffffffffffffff50);
        ::operator+((QLatin1String *)in_stack_ffffffffffffff50,(QStringView *)this_00);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)this_00);
        QXmlStreamReader::raiseError((QString *)this_00);
        QString::~QString((QString *)0x19f0f8);
        in_stack_ffffffffffffff48 = this_00;
        this_00 = pDVar5;
      }
      else {
        in_stack_ffffffffffffff50 = (DomConnection *)operator_new(0x70);
        memset(in_stack_ffffffffffffff50,0,0x70);
        DomConnection::DomConnection(in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff50;
        DomConnection::read(in_stack_ffffffffffffff50,(int)this_00,__buf_00,__nbytes_00);
        QList<DomConnection_*>::append((QList<DomConnection_*> *)0x19f091,in_stack_ffffffffffffff48)
        ;
      }
    }
  } while (iVar3 != 5);
LAB_0019f103:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnections::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"connection"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnection();
                v->read(reader);
                m_connection.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}